

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  archive_string_conv *paVar3;
  wchar_t local_34;
  wchar_t ret;
  cab *cab;
  char *val_local;
  char *key_local;
  archive_read *a_local;
  
  local_34 = L'\xffffffe7';
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"hdrcharset");
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      archive_set_error(&a->archive,-1,"cab: hdrcharset option needs a character-set name");
    }
    else {
      paVar3 = archive_string_conversion_from_charset(&a->archive,val,L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0xb8) = paVar3;
      if (*(long *)((long)pvVar1 + 0xb8) == 0) {
        local_34 = L'\xffffffe2';
      }
      else {
        local_34 = L'\0';
      }
    }
    a_local._4_4_ = local_34;
  }
  else {
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cab_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct cab *cab;
	int ret = ARCHIVE_FAILED;

	cab = (struct cab *)(a->format->data);
	if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "cab: hdrcharset option needs a character-set name");
		else {
			cab->sconv = archive_string_conversion_from_charset(
			    &a->archive, val, 0);
			if (cab->sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}